

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.cpp
# Opt level: O0

IrrXMLReaderUTF16 * irr::io::createIrrXMLReaderUTF16(FILE *file)

{
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this;
  CFileReadCallBack *this_00;
  FILE *file_local;
  
  this = (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *)operator_new(0x88);
  this_00 = (CFileReadCallBack *)operator_new(0x18);
  CFileReadCallBack::CFileReadCallBack(this_00,file);
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::CXMLReaderImpl
            (this,(IFileReadCallBack *)this_00,true);
  return &this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>;
}

Assistant:

IrrXMLReaderUTF16* createIrrXMLReaderUTF16(FILE* file)
{
	return new CXMLReaderImpl<char16, IXMLBase>(new CFileReadCallBack(file)); 
}